

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_miniscript_andor
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  int iVar1;
  size_t local_78;
  size_t indexes [3];
  uchar local_53 [3];
  uchar last_op [1];
  uchar second_op [1];
  size_t *psStack_50;
  uchar first_op [1];
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  local_53[2] = 100;
  local_53[1] = 0x67;
  local_53[0] = 'h';
  local_78 = 0;
  indexes[0] = 2;
  indexes[1] = 1;
  psStack_50 = write_len;
  iVar1 = generate_by_miniscript_concat
                    (node,parent,derive_child_num,3,&local_78,(uchar *)0x0,0,local_53 + 2,1,
                     local_53 + 1,1,local_53,1,script,script_len,write_len);
  return iVar1;
}

Assistant:

static int generate_by_miniscript_andor(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    unsigned char first_op[] = {OP_NOTIF};
    unsigned char second_op[] = {OP_ELSE};
    unsigned char last_op[] = {OP_ENDIF};
    const size_t indexes[] = {0, 2, 1};
    /* [X] NOTIF 0 ELSE [Y] ENDIF */
    return generate_by_miniscript_concat(
        node,
        parent,
        derive_child_num,
        3,
        indexes,
        NULL,
        0,
        first_op,
        sizeof(first_op) / sizeof(unsigned char),
        second_op,
        sizeof(second_op) / sizeof(unsigned char),
        last_op,
        sizeof(last_op) / sizeof(unsigned char),
        script,
        script_len,
        write_len);
}